

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epanet3.cpp
# Opt level: O3

int EN_runEpanet(char *inpFile,char *rptFile,char *outFile)

{
  int iVar1;
  clock_t cVar2;
  ostream *poVar3;
  clock_t cVar4;
  int seconds;
  long lVar5;
  char *pcVar6;
  double dVar7;
  undefined1 local_1778 [8];
  Project p;
  stringstream ss;
  long local_1e0;
  string local_1d8 [104];
  ios_base local_170 [264];
  double local_68;
  ostream *local_60;
  undefined1 local_58 [8];
  int t;
  char local_48 [20];
  int local_34 [2];
  int tstep;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n... EPANET Version 3.0\n",0x18);
  Epanet::Project::Project((Project *)local_1778);
  cVar2 = clock();
  iVar1 = Epanet::Project::openReport((Project *)local_1778,rptFile);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n    Reading input file ...",0x1b);
    iVar1 = Epanet::Project::load((Project *)local_1778,inpFile);
    if (iVar1 == 0) {
      iVar1 = Epanet::Project::openOutput((Project *)local_1778,outFile);
      if (iVar1 == 0) {
        Epanet::Project::writeSummary((Project *)local_1778);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n    Initializing solver ...",0x1c);
        iVar1 = Epanet::Project::initSolver((Project *)local_1778,false);
        if (iVar1 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n    ",5);
          local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffff00000000);
          local_34[0] = 0;
          local_60 = (ostream *)&local_1e0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\r    Solving network at ",0x18);
            Utilities::getTime_abi_cxx11_
                      ((string *)&p.networkEmpty,
                       (Utilities *)(ulong)(uint)(local_34[0] + local_58._0_4_),seconds);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)p._5504_8_,_ss);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," hrs ...        ",0x10);
            if ((long *)p._5504_8_ != &local_1e0) {
              operator_delete((void *)p._5504_8_);
            }
            iVar1 = Epanet::Project::runSolver((Project *)local_1778,(int *)local_58);
            Epanet::Project::writeMsgLog((Project *)local_1778);
            if (iVar1 != 0) goto LAB_0012245d;
            iVar1 = Epanet::Project::advanceSolver((Project *)local_1778,local_34);
          } while ((iVar1 == 0) && (0 < local_34[0]));
          if (iVar1 == 0) {
            cVar4 = clock();
            std::__cxx11::stringstream::stringstream((stringstream *)&p.networkEmpty);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1e0,"\n  Simulation completed in ",0x1b);
            std::__cxx11::stringbuf::str();
            Epanet::Project::writeMsg((Project *)local_1778,(string *)local_58);
            if (local_58 != (undefined1  [8])local_48) {
              operator_delete((void *)local_58);
            }
            local_58 = (undefined1  [8])local_48;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
            std::__cxx11::stringbuf::str(local_1d8);
            dVar7 = (double)(cVar4 - cVar2) / 1000000.0;
            if (local_58 != (undefined1  [8])local_48) {
              local_68 = dVar7;
              operator_delete((void *)local_58);
              dVar7 = local_68;
            }
            if (0.001 <= dVar7) {
              *(undefined8 *)(local_1d8 + *(long *)(local_1e0 + -0x18)) = 3;
              local_60 = std::ostream::_M_insert<double>(dVar7);
              lVar5 = 5;
              pcVar6 = " sec.";
            }
            else {
              lVar5 = 0xc;
              pcVar6 = "< 0.001 sec.";
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_60,pcVar6,lVar5);
            std::__cxx11::stringbuf::str();
            Epanet::Project::writeMsg((Project *)local_1778,(string *)local_58);
            if (local_58 != (undefined1  [8])local_48) {
              operator_delete((void *)local_58);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n    Writing report ...                           ",
                       0x32);
            iVar1 = Epanet::Project::writeReport((Project *)local_1778);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "\n    Simulation completed.                         \n",0x34);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n... EPANET completed in ",0x19);
            std::__cxx11::stringbuf::str();
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_58,_t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if (local_58 != (undefined1  [8])local_48) {
              operator_delete((void *)local_58);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&p.networkEmpty);
            std::ios_base::~ios_base(local_170);
            if (iVar1 == 0) {
              iVar1 = 0;
              goto LAB_00122481;
            }
          }
        }
      }
    }
  }
LAB_0012245d:
  Epanet::Project::writeMsgLog((Project *)local_1778);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n    There were errors. See report file for details.\n",0x36)
  ;
LAB_00122481:
  Epanet::Project::~Project((Project *)local_1778);
  return iVar1;
}

Assistant:

int EN_runEpanet(const char* inpFile, const char* rptFile, const char* outFile)
{
    std::cout << "\n... EPANET Version 3.0\n";

    // ... declare a Project variable and an error indicator
    Project p;
    int err = 0;

    // ... initialize execution time clock
    clock_t start_t = clock();

    for (;;)
    {
        // ... open the command line files and load network data
        if ( (err = p.openReport(rptFile)) ) break;
        std::cout << "\n    Reading input file ...";
        if ( (err = p.load(inpFile)) ) break;
        if ( (err = p.openOutput(outFile)) ) break;
        p.writeSummary();

        // ... initialize the solver
        std::cout << "\n    Initializing solver ...";
        if ( (err = p.initSolver(false)) ) break;
        std::cout << "\n    ";

        // ... step through each time period
        int t = 0;
        int tstep = 0;
        do
        {
            std::cout << "\r    Solving network at "                     //r
                << Utilities::getTime(t+tstep) << " hrs ...        ";

            // ... run solver to compute hydraulics
            err = p.runSolver(&t);
            p.writeMsgLog();

            // ... advance solver to next period in time while solving for water quality
            if ( !err ) err = p.advanceSolver(&tstep);
        } while (tstep > 0 && !err );
        break;
    }

    // ... simulation was successful
    if ( !err )
    {
        // ... report execution time
        clock_t end_t = clock();
        double cpu_t = ((double) (end_t - start_t)) / CLOCKS_PER_SEC;
        std::stringstream ss;
        ss << "\n  Simulation completed in ";
        p.writeMsg(ss.str());
        ss.str("");
        if ( cpu_t < 0.001 ) ss << "< 0.001 sec.";
        else ss << std::setprecision(3) << cpu_t << " sec.";
        p.writeMsg(ss.str());

        // ... report simulation results
        std::cout << "\n    Writing report ...                           ";
        err = p.writeReport();
        std::cout << "\n    Simulation completed.                         \n";
        std::cout << "\n... EPANET completed in " << ss.str() << "\n";
    }

    if ( err )
    {
        p.writeMsgLog();
        std::cout << "\n\n    There were errors. See report file for details.\n";
        return err;
    }
    return 0;
}